

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void stderr_logger(nng_log_level level,nng_log_facility facility,char *msgid,char *msg,_Bool timechk
                  )

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  char *local_198;
  char local_148 [7];
  _Bool trailing_nl;
  char new_day [64];
  undefined1 local_100 [8];
  tm tm_buf;
  uint64_t uStack_c0;
  uint32_t nsec;
  uint64_t sec;
  time_t now;
  tm *tm;
  char when [64];
  char *local_60;
  char *level_str;
  char *pcStack_50;
  _Bool colors;
  char *sgr0;
  char *sgr;
  _Bool timechk_local;
  char *msg_local;
  char *msgid_local;
  nng_log_facility facility_local;
  nng_log_level level_local;
  
  iVar1 = nni_time_get(&stack0xffffffffffffff40,(uint32_t *)((long)&tm_buf.tm_zone + 4));
  if (iVar1 != 0) {
    uStack_c0 = 0;
    tm_buf.tm_zone._4_4_ = 0;
  }
  sec = uStack_c0;
  iVar1 = fileno(_stderr);
  iVar1 = isatty(iVar1);
  bVar5 = false;
  if (iVar1 != 0) {
    pcVar2 = getenv("TERM");
    bVar5 = false;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = getenv("TERM");
      bVar5 = *pcVar2 != '\0';
    }
  }
  pcVar2 = getenv("NNG_LOG_NO_COLOR");
  if ((pcVar2 != (char *)0x0) || (pcVar2 = getenv("NO_COLOR"), pcVar2 != (char *)0x0)) {
    bVar5 = false;
  }
  now = (time_t)localtime_r((time_t *)&sec,(tm *)local_100);
  switch(level) {
  case NNG_LOG_ERR:
    sgr0 = "\x1b[31m";
    pcStack_50 = "\x1b[0m";
    local_60 = "ERROR";
    break;
  case NNG_LOG_WARN:
    sgr0 = "\x1b[33m";
    pcStack_50 = "\x1b[0m";
    local_60 = "WARN";
    break;
  case NNG_LOG_NOTICE:
    sgr0 = "\x1b[1m";
    pcStack_50 = "\x1b[0m";
    local_60 = "NOTICE";
    break;
  case NNG_LOG_INFO:
    sgr0 = "";
    pcStack_50 = "";
    local_60 = "INFO";
    break;
  case NNG_LOG_DEBUG:
    sgr0 = "\x1b[36m";
    pcStack_50 = "\x1b[0m";
    local_60 = "DEBUG";
    break;
  default:
    sgr0 = "";
    pcStack_50 = "";
    local_60 = "NONE";
  }
  if (!bVar5) {
    sgr0 = "";
    pcStack_50 = "";
  }
  if (((timechk) && (NNG_LOG_INFO < log_level)) &&
     ((stderr_logger::last_log.tm_mday != ((tm *)now)->tm_mday ||
      ((stderr_logger::last_log.tm_mon != ((tm *)now)->tm_mon ||
       (stderr_logger::last_log.tm_year != ((tm *)now)->tm_year)))))) {
    strftime(local_148,0x40,"Date changed to %Y-%m-%d, TZ is %z",(tm *)now);
    stderr_logger(NNG_LOG_DEBUG,facility,"NNG-DATE",local_148,false);
    memcpy(&stderr_logger::last_log,(void *)now,0x38);
  }
  strftime((char *)&tm,0x40,"%H:%M:%S",(tm *)now);
  sVar3 = strlen(msg);
  bVar5 = false;
  if (sVar3 != 0) {
    sVar3 = strlen(msg);
    bVar5 = msg[sVar3 - 1] == '\n';
  }
  local_198 = msgid;
  if (msgid == (char *)0x0) {
    local_198 = "";
  }
  pcVar2 = "";
  if (msgid != (char *)0x0) {
    pcVar2 = ": ";
  }
  pcVar4 = "\n";
  if (bVar5) {
    pcVar4 = "";
  }
  fprintf(_stderr,"%s[%-6s]: %s.%03d: %s%s%s%s%s",sgr0,local_60,&tm,
          (ulong)(tm_buf.tm_zone._4_4_ / 1000000),local_198,pcVar2,msg,pcStack_50,pcVar4);
  return;
}

Assistant:

void
stderr_logger(nng_log_level level, nng_log_facility facility,
    const char *msgid, const char *msg, bool timechk)
{
	const char *sgr, *sgr0;
	// Initial implementation.
	bool             colors = false;
	const char      *level_str;
	char             when[64];
	struct tm       *tm;
	static struct tm last_log = { 0 };
	time_t           now;
	uint64_t         sec;
	uint32_t         nsec;

	NNI_ARG_UNUSED(facility);

	if (nni_time_get(&sec, &nsec) != 0) {
		// default to the epoch if we can't get a clock for some reason
		sec  = 0;
		nsec = 0;
	}
	now = (time_t) sec;

#ifdef NNG_PLATFORM_WINDOWS
	// NB: We are blithely assuming the user has a modern console.
	colors = _isatty(_fileno(stderr));
#elif defined(NNG_HAVE_SYSLOG)
	// Only assuming we can use colors (and attributes) if stderr is a tty
	// and $TERM is reasonable. We assume the terminal supports ECMA-48,
	// which is true on every reasonable system these days.
	colors = isatty(fileno(stderr)) && (getenv("TERM") != NULL) &&
	    (getenv("TERM")[0] != 0);
#else
	colors = false;
#endif

	// Escape hatch to prevent colorizing logs if we have to.  Users on
	// legacy Windows can set this, or on ancient HP terminals or
	// something.  Also in the same way that no-color.org proposes.
	// The reason for both is to allow suppression *only* for NNG.  There
	// is no good reason to enable it to override the presence of NO_COLOR.
	if ((getenv("NNG_LOG_NO_COLOR") != NULL) ||
	    (getenv("NO_COLOR") != NULL)) {
		colors = false;
	}
#ifdef NNG_HAVE_LOCALTIME_R
	struct tm tm_buf;
	// No timezone offset, not strictly ISO8601 compliant
	tm = localtime_r(&now, &tm_buf);
#else
	tm = localtime(&now);
#endif
	switch (level) {
	case NNG_LOG_ERR:
		sgr       = "\x1b[31m"; // red
		sgr0      = "\x1b[0m";
		level_str = "ERROR";
		break;
	case NNG_LOG_WARN:
		sgr       = "\x1b[33m"; // yellow
		sgr0      = "\x1b[0m";
		level_str = "WARN";
		break;
	case NNG_LOG_NOTICE:
		sgr       = "\x1b[1m"; // bold
		sgr0      = "\x1b[0m";
		level_str = "NOTICE";
		break;
	case NNG_LOG_DEBUG:
		sgr       = "\x1b[36m"; // cyan
		sgr0      = "\x1b[0m";
		level_str = "DEBUG";
		break;
	case NNG_LOG_INFO:
		sgr       = "";
		sgr0      = "";
		level_str = "INFO";
		break;
	default:
		sgr       = "";
		sgr0      = "";
		level_str = "NONE";
		break;
	}

	if (!colors) {
		sgr  = "";
		sgr0 = "";
	}

	if (timechk && (log_level >= NNG_LOG_DEBUG) &&
	    ((last_log.tm_mday != tm->tm_mday) ||
	        (last_log.tm_mon != tm->tm_mon) ||
	        (last_log.tm_year != tm->tm_year))) {
		char new_day[64];
		strftime(new_day, sizeof(new_day),
		    "Date changed to %Y-%m-%d, TZ is %z", tm);
		stderr_logger(
		    NNG_LOG_DEBUG, facility, "NNG-DATE", new_day, false);
		last_log = *tm;
	}

	strftime(when, sizeof(when), "%H:%M:%S", tm);
	// we print with millisecond resolution
	bool trailing_nl =
	    ((strlen(msg) != 0) && msg[strlen(msg) - 1] == '\n');
	(void) fprintf(stderr, "%s[%-6s]: %s.%03d: %s%s%s%s%s", sgr, level_str,
	    when, nsec / 1000000, msgid ? msgid : "", msgid ? ": " : "", msg,
	    sgr0, trailing_nl ? "" : "\n");
}